

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visitCallIndirect(wasm::CallIndirect__(void *this,CallIndirect *curr)

{
  ScopedTemp *this_00;
  Expression *curr_00;
  ValueBuilder *this_01;
  IString nextResult;
  IString possible;
  IString possible_00;
  ExpressionProcessor *pEVar1;
  bool bVar2;
  JsType JVar3;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar4;
  value_type this_02;
  Ref RVar5;
  Ref RVar6;
  Type TVar7;
  char *pcVar8;
  reference ppSVar9;
  Expression **ppEVar10;
  Ref *pRVar11;
  Value *pVVar12;
  reference ppSVar13;
  Ref RVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  IString op;
  undefined1 auVar15 [16];
  Iterator IVar16;
  Iterator IVar17;
  IString IVar18;
  Iterator IVar19;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  Expression *operand_3;
  Iterator __end3_3;
  Iterator __begin3_3;
  ExpressionList *__range3_3;
  ScopedTemp *temp_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
  *__range3_2;
  Expression **operand_2;
  IString temp_1;
  size_t i;
  Ref local_618;
  Ref theCall;
  IString temp;
  value_type local_588;
  Expression *local_580;
  Expression *operand_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  ExpressionList *__range3_1;
  vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
  temps;
  Type local_528;
  undefined1 local_520 [8];
  ScopedTemp idx;
  Ref target;
  Expression *operand;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  EffectAnalyzer targetEffects;
  bool mustReorder;
  Fatal local_1a8;
  CallIndirect *local_20;
  CallIndirect *curr_local;
  ExpressionProcessor *this_local;
  Ref ret;
  
  local_20 = curr;
  curr_local = (CallIndirect *)this;
  if (((byte)curr[0x50] & 1) != 0) {
    Fatal::Fatal(&local_1a8);
    Fatal::operator<<(&local_1a8,(char (*) [40])"tail calls not yet supported in wasm2js");
    Fatal::~Fatal(&local_1a8);
  }
  targetEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)&__range3,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),*(Expression **)(curr + 0x38));
  bVar2 = EffectAnalyzer::hasAnything((EffectAnalyzer *)&__range3);
  if (bVar2) {
    pAVar4 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             (local_20 + 0x18);
    IVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(pAVar4);
    __end3.index = (size_t)IVar16.parent;
    IVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(pAVar4);
    while( true ) {
      __end3.parent = (ArenaVector<wasm::Expression_*> *)IVar16.index;
      operand = (Expression *)IVar16.parent;
      bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end3.index,(Iterator *)&operand);
      if (!bVar2) break;
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&__end3.index);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)&target,(PassOptions *)(*this + 0x60),
                 *(Module **)((long)this + 0x20),*ppEVar10);
      bVar2 = EffectAnalyzer::invalidates((EffectAnalyzer *)&__range3,(EffectAnalyzer *)&target);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&target);
      if (bVar2) {
        targetEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
        break;
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3.index);
      IVar16.index = (size_t)__end3.parent;
      IVar16.parent = (ArenaVector<wasm::Expression_*> *)operand;
    }
  }
  IVar18.str._M_str = _realloc;
  IVar18.str._M_len = EXPRESSION_RESULT;
  idx._32_8_ = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(local_20 + 0x38),IVar18)
  ;
  auVar15 = makeJsCoercion((Ref)idx._32_8_,JS_INT);
  name_02.str._M_str = auVar15._8_8_;
  RVar6.inst = auVar15._0_8_;
  if ((targetEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) ==
      0) {
    name_02.str._M_len = WASM_MEMORY_SIZE;
    RVar14 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_02);
    RVar6 = cashew::ValueBuilder::makeSub(RVar14,RVar6);
    this_local = (ExpressionProcessor *)cashew::ValueBuilder::makeCall(RVar6);
    pAVar4 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             (local_20 + 0x18);
    IVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(pAVar4);
    __end3_3.index = (size_t)IVar16.parent;
    IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(pAVar4);
    while( true ) {
      __end3_3.parent = (ArenaVector<wasm::Expression_*> *)IVar19.index;
      operand_3 = (Expression *)IVar19.parent;
      TVar7.id = (uintptr_t)&operand_3;
      bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end3_3.index,(Iterator *)TVar7.id);
      pEVar1 = this_local;
      if (!bVar2) break;
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&__end3_3.index);
      curr_00 = *ppEVar10;
      pRVar11 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
      pVVar12 = cashew::Ref::operator->(pRVar11);
      nextResult.str._M_str = _realloc;
      nextResult.str._M_len = EXPRESSION_RESULT;
      RVar6 = visit(wasm::Expression*,wasm::IString_(this,curr_00,nextResult);
      cashew::Value::push_back(pVVar12,RVar6);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3_3.index);
      IVar19.index = (size_t)__end3_3.parent;
      IVar19.parent = (ArenaVector<wasm::Expression_*> *)operand_3;
    }
    JVar3 = ::wasm::wasmToJsType(*(wasm **)(local_20 + 8),TVar7);
    this_local = (ExpressionProcessor *)makeJsCoercion((Ref)pEVar1,JVar3);
  }
  else {
    cashew::Ref::Ref((Ref *)&this_local,(Value *)0x0);
    Type::Type(&local_528,i32);
    temps.
    super__Vector_base<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)NO_RESULT;
    possible_00.str._M_str = cashew::RETURN;
    possible_00.str._M_len = (size_t)NO_RESULT;
    RVar14.inst = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_520,local_528,*this,*(Function **)((long)this + 0x18),possible_00);
    std::
    vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>::
    vector((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
            *)&__range3_1);
    pAVar4 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             (local_20 + 0x18);
    IVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(pAVar4);
    __end3_1.index = (size_t)IVar16.parent;
    IVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(pAVar4);
    while( true ) {
      __end3_1.parent = (ArenaVector<wasm::Expression_*> *)IVar17.index;
      operand_1 = (Expression *)IVar17.parent;
      bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end3_1.index,(Iterator *)&operand_1);
      if (!bVar2) break;
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&__end3_1.index);
      local_580 = *ppEVar10;
      this_02 = (value_type)operator_new(0x28);
      possible.str._M_str = cashew::RETURN;
      possible.str._M_len = (size_t)NO_RESULT;
      RVar14.inst = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (this_02,(Type)(local_580->type).id,*this,*(Function **)((long)this + 0x18),possible
                );
      local_588 = this_02;
      std::
      vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
      ::push_back((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                   *)&__range3_1,&local_588);
      ppSVar9 = std::
                vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                ::back((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                        *)&__range3_1);
      RVar5 = visitAndAssign(wasm::Expression*,wasm::IString_
                        (this,local_580,(IString)((*ppSVar9)->temp).str);
      sequenceAppend((Ref *)&this_local,RVar5);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3_1.index);
      IVar17.index = (size_t)__end3_1.parent;
      IVar17.parent = (ArenaVector<wasm::Expression_*> *)operand_1;
    }
    IVar18 = processFunctionBody::ExpressionProcessor::ScopedTemp::getName((ScopedTemp *)local_520);
    name.str._M_str = IVar18.str._M_str;
    name.str._M_len = (size_t)name.str._M_str;
    RVar5 = cashew::ValueBuilder::makeName((ValueBuilder *)IVar18.str._M_len,name);
    op.str._M_str = (char *)RVar6.inst;
    op.str._M_len = BLOCK;
    theCall.inst = RVar6.inst;
    RVar6 = cashew::ValueBuilder::makeBinary(RVar5.inst,cashew::SET,op,RVar14);
    sequenceAppend((Ref *)&this_local,RVar6);
    name_00.str._M_str = extraout_RDX;
    name_00.str._M_len = WASM_MEMORY_SIZE;
    RVar6 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_00);
    TVar7.id = (uintptr_t)
               processFunctionBody::ExpressionProcessor::ScopedTemp::getAstName
                         ((ScopedTemp *)local_520);
    RVar6 = cashew::ValueBuilder::makeSub(RVar6,(Ref)TVar7.id);
    local_618 = cashew::ValueBuilder::makeCall(RVar6);
    for (temp_1.str._M_str = (char *)0x0;
        pcVar8 = (char *)std::
                         vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                         ::size((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                                 *)&__range3_1), RVar6.inst = local_618.inst,
        temp_1.str._M_str < pcVar8; temp_1.str._M_str = temp_1.str._M_str + 1) {
      ppSVar9 = std::
                vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                ::operator[]((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                              *)&__range3_1,(size_type)temp_1.str._M_str);
      this_01 = (ValueBuilder *)((*ppSVar9)->temp).str._M_len;
      TVar7.id = (uintptr_t)((*ppSVar9)->temp).str._M_str;
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (local_20 + 0x18),(size_t)temp_1.str._M_str);
      pRVar11 = (Ref *)cashew::Ref::operator[]((uint)&local_618);
      pVVar12 = cashew::Ref::operator->(pRVar11);
      name_01.str._M_str = extraout_RDX_00;
      name_01.str._M_len = TVar7.id;
      RVar6 = cashew::ValueBuilder::makeName(this_01,name_01);
      JVar3 = ::wasm::wasmToJsType((wasm *)((*ppEVar10)->type).id,TVar7);
      TVar7.id = makeJsCoercion(RVar6,JVar3);
      cashew::Value::push_back(pVVar12,(Ref)TVar7.id);
    }
    JVar3 = ::wasm::wasmToJsType(*(wasm **)(local_20 + 8),TVar7);
    local_618.inst = (Value *)makeJsCoercion(RVar6,JVar3);
    sequenceAppend((Ref *)&this_local,local_618);
    __end3_2 = std::
               vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
               ::begin((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                        *)&__range3_1);
    temp_2 = (ScopedTemp *)
             std::
             vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
             ::end((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
                    *)&__range3_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<ExpressionProcessor::ScopedTemp_**,_std::vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>_>
                               *)&temp_2), bVar2) {
      ppSVar13 = __gnu_cxx::
                 __normal_iterator<ExpressionProcessor::ScopedTemp_**,_std::vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>_>
                 ::operator*(&__end3_2);
      this_00 = *ppSVar13;
      if (this_00 != (ScopedTemp *)0x0) {
        processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp(this_00);
        operator_delete(this_00,0x28);
      }
      __gnu_cxx::
      __normal_iterator<ExpressionProcessor::ScopedTemp_**,_std::vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>_>
      ::operator++(&__end3_2);
    }
    std::
    vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>::
    ~vector((vector<ExpressionProcessor::ScopedTemp_*,_std::allocator<ExpressionProcessor::ScopedTemp_*>_>
             *)&__range3_1);
    processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_520);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&__range3);
  return (Ref)(Value *)this_local;
}

Assistant:

Ref visitCallIndirect(CallIndirect* curr) {
      if (curr->isReturn) {
        Fatal() << "tail calls not yet supported in wasm2js";
      }
      // If the target has effects that interact with the operands, we must
      // reorder it to the start.
      bool mustReorder = false;
      EffectAnalyzer targetEffects(parent->options, *module, curr->target);
      if (targetEffects.hasAnything()) {
        for (auto* operand : curr->operands) {
          if (targetEffects.invalidates(
                EffectAnalyzer(parent->options, *module, operand))) {
            mustReorder = true;
            break;
          }
        }
      }
      // Ensure the function pointer is a number. In general in wasm2js we are
      // ok with true/false being present, as they are immediately cast to a
      // number anyhow on their use. However, FUNCTION_TABLE[true] is *not* the
      // same as FUNCTION_TABLE[1], so we must cast. This is a rare exception
      // because FUNCTION_TABLE is just a normal JS object, not a typed array
      // or a mathematical operation (all of which coerce to a number for us).
      auto target = visit(curr->target, EXPRESSION_RESULT);
      target = makeJsCoercion(target, JS_INT);
      if (mustReorder) {
        Ref ret;
        ScopedTemp idx(Type::i32, parent, func);
        std::vector<ScopedTemp*> temps; // TODO: utility class, with destructor?
        for (auto* operand : curr->operands) {
          temps.push_back(new ScopedTemp(operand->type, parent, func));
          IString temp = temps.back()->temp;
          sequenceAppend(ret, visitAndAssign(operand, temp));
        }
        sequenceAppend(ret,
                       ValueBuilder::makeBinary(
                         ValueBuilder::makeName(idx.getName()), SET, target));
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), idx.getAstName()));
        for (size_t i = 0; i < temps.size(); i++) {
          IString temp = temps[i]->temp;
          auto& operand = curr->operands[i];
          theCall[2]->push_back(makeJsCoercion(ValueBuilder::makeName(temp),
                                               wasmToJsType(operand->type)));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        sequenceAppend(ret, theCall);
        for (auto temp : temps) {
          delete temp;
        }
        return ret;
      } else {
        // Target has no side effects, emit simple code
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), target));
        for (auto* operand : curr->operands) {
          theCall[2]->push_back(visit(operand, EXPRESSION_RESULT));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        return theCall;
      }
    }